

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DoubletonEquationPS::DoubletonEquationPS(DoubletonEquationPS *this,DoubletonEquationPS *old)

{
  long in_RSI;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  cpp_dec_float<50U,_int,_void> *in_stack_ffffffffffffff30;
  
  PostStep::PostStep((PostStep *)in_stack_ffffffffffffff30,(PostStep *)in_RDI);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__DoubletonEquationPS_004f0ee8;
  in_RDI->exp = *(int *)(in_RSI + 0x28);
  *(undefined4 *)&in_RDI->neg = *(undefined4 *)(in_RSI + 0x2c);
  in_RDI->fpclass = *(fpclass_type *)(in_RSI + 0x30);
  *(byte *)&in_RDI->prec_elem = *(byte *)(in_RSI + 0x34) & 1;
  *(byte *)((long)&in_RDI->prec_elem + 1) = *(byte *)(in_RSI + 0x35) & 1;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  *(byte *)in_RDI[4].data._M_elems = *(byte *)(in_RSI + 0xe0) & 1;
  *(byte *)((long)in_RDI[4].data._M_elems + 1) = *(byte *)(in_RSI + 0xe1) & 1;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff30,in_RDI);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_ffffffffffffff30,
                 (DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_RDI);
  return;
}

Assistant:

DoubletonEquationPS(const DoubletonEquationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_i(old.m_i)
         , m_maxSense(old.m_maxSense)
         , m_jFixed(old.m_jFixed)
         , m_jObj(old.m_jObj)
         , m_kObj(old.m_kObj)
         , m_aij(old.m_aij)
         , m_strictLo(old.m_strictLo)
         , m_strictUp(old.m_strictUp)
         , m_newLo(old.m_newLo)
         , m_newUp(old.m_newUp)
         , m_oldLo(old.m_oldLo)
         , m_oldUp(old.m_oldUp)
         , m_Lo_j(old.m_Lo_j)
         , m_Up_j(old.m_Up_j)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_col(old.m_col)
      {}